

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O1

bool * __thiscall JSON::JSONValue::getBoolValue(JSONValue *this)

{
  ostream *poVar1;
  undefined1 *puVar2;
  string local_38;
  
  if (this->type != BOOLEAN) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error requesting JSON bool value from ",0x26);
    getTypeAsString_abi_cxx11_(&local_38,this);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_38._M_dataplus._M_p,local_38._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," (",2);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->type);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    delete_data(this);
    this->type = BOOLEAN;
    puVar2 = (undefined1 *)operator_new(1);
    this->data = puVar2;
    *puVar2 = 0;
  }
  return (bool *)this->data;
}

Assistant:

bool &JSONValue::getBoolValue() {
	if(getType()!=BOOLEAN)
	{
		#ifdef JSON_TYPE_ERRORS_ON
		cerr << "Error requesting JSON bool value from " << getTypeAsString() << " (" << getType() << ")" << endl;
		#endif
		setBoolValue(false);
	}
	return *((bool*)data);
}